

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walkWindowList(Walker *pWalker,Window *pList,int bOneOnly)

{
  int iVar1;
  
  if (pList != (Window *)0x0) {
    do {
      iVar1 = sqlite3WalkExprList(pWalker,pList->pOrderBy);
      if (iVar1 != 0) {
        return 2;
      }
      iVar1 = sqlite3WalkExprList(pWalker,pList->pPartition);
      if (iVar1 != 0) {
        return 2;
      }
      if ((pList->pFilter != (Expr *)0x0) &&
         (iVar1 = sqlite3WalkExprNN(pWalker,pList->pFilter), iVar1 != 0)) {
        return 2;
      }
      if ((pList->pStart != (Expr *)0x0) &&
         (iVar1 = sqlite3WalkExprNN(pWalker,pList->pStart), iVar1 != 0)) {
        return 2;
      }
      if (pList->pEnd == (Expr *)0x0) {
        if (bOneOnly != 0) {
          return 0;
        }
      }
      else {
        iVar1 = sqlite3WalkExprNN(pWalker,pList->pEnd);
        if (iVar1 != 0 || bOneOnly != 0) {
          return (uint)(iVar1 != 0) * 2;
        }
      }
      pList = pList->pNextWin;
    } while (pList != (Window *)0x0);
  }
  return 0;
}

Assistant:

static int walkWindowList(Walker *pWalker, Window *pList, int bOneOnly){
  Window *pWin;
  for(pWin=pList; pWin; pWin=pWin->pNextWin){
    int rc;
    rc = sqlite3WalkExprList(pWalker, pWin->pOrderBy);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExprList(pWalker, pWin->pPartition);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pFilter);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pStart);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pEnd);
    if( rc ) return WRC_Abort;
    if( bOneOnly ) break;
  }
  return WRC_Continue;
}